

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,Message *message)

{
  size_type *psVar1;
  string local_68;
  undefined1 local_48 [8];
  TraceInfo trace;
  
  psVar1 = &trace.message._M_string_length;
  trace.message._M_dataplus._M_p = (pointer)0x0;
  trace.message._M_string_length._0_1_ = 0;
  local_48 = (undefined1  [8])file;
  trace.file._0_4_ = line;
  trace._8_8_ = psVar1;
  StringStreamToString(&local_68,(message->ss_).ptr_);
  internal::ScopedTrace();
  UnitTest::GetInstance();
  UnitTest::PushGTestTrace(&UnitTest::GetInstance::instance,(TraceInfo *)local_48);
  if ((size_type *)trace._8_8_ != psVar1) {
    operator_delete((void *)trace._8_8_,
                    CONCAT71(trace.message._M_string_length._1_7_,
                             (undefined1)trace.message._M_string_length) + 1);
  }
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(&UnitTest::mutex_) {
  TraceInfo trace;
  trace.file = file;
  trace.line = line;
  trace.message = message.GetString();

  UnitTest::GetInstance()->PushGTestTrace(trace);
}